

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

void uv__metrics_set_provider_entry_time(uv_loop_t *loop)

{
  void *pvVar1;
  uint64_t uVar2;
  uint64_t now;
  uv__loop_metrics_t *loop_metrics;
  uv_loop_t *loop_local;
  
  if ((*loop->internal_fields & 1) != 0) {
    uVar2 = uv_hrtime();
    pvVar1 = loop->internal_fields;
    uv_mutex_lock((uv_mutex_t *)((long)pvVar1 + 0x98));
    *(uint64_t *)((long)pvVar1 + 0x88) = uVar2;
    uv_mutex_unlock((uv_mutex_t *)((long)pvVar1 + 0x98));
  }
  return;
}

Assistant:

void uv__metrics_set_provider_entry_time(uv_loop_t* loop) {
  uv__loop_metrics_t* loop_metrics;
  uint64_t now;

  if (!(uv__get_internal_fields(loop)->flags & UV_METRICS_IDLE_TIME))
    return;

  now = uv_hrtime();
  loop_metrics = uv__get_loop_metrics(loop);
  uv_mutex_lock(&loop_metrics->lock);
  loop_metrics->provider_entry_time = now;
  uv_mutex_unlock(&loop_metrics->lock);
}